

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,RandSequenceStatementSyntax *syntax)

{
  size_t sVar1;
  pointer ppPVar2;
  ProductionSyntax *syntax_00;
  SyntaxNode *syntax_01;
  SourceLocation defaultLoc;
  StatementBlockSymbol *pSVar3;
  RandSeqProductionSymbol *member;
  long lVar4;
  string_view sVar5;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_48;
  
  defaultLoc = parsing::Token::location(&syntax->randsequence);
  getLabel(&local_48,&syntax->super_StatementSyntax,defaultLoc);
  sVar5._M_str = (char *)local_48.second;
  sVar5._M_len = (size_t)local_48.first._M_str;
  pSVar3 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)local_48.first._M_len,sVar5,
                       (SourceLocation)0x0,Sequential,(optional<slang::ast::VariableLifetime>)scope)
  ;
  sVar1 = (syntax->productions).
          super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppPVar2 = (syntax->productions).
              super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar4 = 0;
    do {
      syntax_00 = *(ProductionSyntax **)((long)ppPVar2 + lVar4);
      syntax_01 = (syntax_00->super_SyntaxNode).previewNode;
      if (syntax_01 != (SyntaxNode *)0x0) {
        Scope::addMembers(&pSVar3->super_Scope,syntax_01);
      }
      sVar5 = parsing::Token::valueText(&syntax_00->name);
      if (sVar5._M_len != 0) {
        member = RandSeqProductionSymbol::fromSyntax(scope,syntax_00);
        Scope::insertMember(&pSVar3->super_Scope,&member->super_Symbol,
                            (pSVar3->super_Scope).lastMember,false,true);
      }
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  return pSVar3;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const RandSequenceStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.randsequence.location());
    auto result = createBlock(scope, syntax, name, loc, StatementBlockKind::Sequential,
                              VariableLifetime::Automatic);

    for (auto prod : syntax.productions) {
        if (prod->previewNode)
            result->addMembers(*prod->previewNode);

        if (prod->name.valueText().empty())
            continue;

        auto& symbol = RandSeqProductionSymbol::fromSyntax(scope, *prod);
        result->addMember(symbol);
    }

    return *result;
}